

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O2

void __thiscall Random_keys::mutacao(Random_keys *this,RK_Individual *ind)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  
  iVar1 = rand();
  if (iVar1 % 100 < 6) {
    iVar2 = rand();
    iVar2 = iVar2 % ind->number_of_edges;
    iVar3 = rand();
    pdVar6 = ind->weights;
  }
  else {
    if (0xf < (uint)(iVar1 % 100)) {
      return;
    }
    iVar4 = rand();
    iVar1 = ind->number_of_edges;
    iVar2 = rand();
    iVar2 = iVar2 % ind->number_of_edges;
    iVar5 = rand();
    iVar3 = rand();
    pdVar6 = ind->weights;
    pdVar6[iVar4 % iVar1] = (double)(iVar5 % 100);
  }
  pdVar6[iVar2] = (double)(iVar3 % 100);
  return;
}

Assistant:

void Random_keys::mutacao(RK_Individual *ind){
    int i = rand() % 100;
    if(i<=5){
        int j = rand() % ind->getNumEdges();
        double peso = rand() % RANGEPESO;
        ind->getWeights()[j] = peso;
    }
    else{
        if(i<=15){
            int j = rand() % ind->getNumEdges();
            int k = rand() % ind->getNumEdges();
            double peso1 = rand() % RANGEPESO;
            double peso2 = rand() % RANGEPESO;
            ind->getWeights()[j] = peso1;
            ind->getWeights()[k] = peso2;
        }
    }
}